

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

void __thiscall QSqlTableModelPrivate::initRecordAndPrimaryIndex(QSqlTableModelPrivate *this)

{
  QSqlRecord *other;
  QSqlIndex *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QSqlIndex *other_00;
  int size;
  QSqlRecord *in_stack_ffffffffffffff80;
  QSqlQueryModelPrivate *this_01;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSqlIndex *)(in_RDI + 0x228);
  other = (QSqlRecord *)(in_RDI + 0x298);
  other_00 = (QSqlIndex *)(local_60 + 0x50);
  QSqlDatabase::record((QSqlDatabase *)other,(QString *)this_00);
  QSqlRecord::operator=(in_stack_ffffffffffffff80,other);
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x16ba1a);
  this_01 = (QSqlQueryModelPrivate *)local_60;
  QSqlDatabase::primaryIndex((QSqlDatabase *)other,(QString *)this_00);
  size = (int)((ulong)other >> 0x20);
  QSqlIndex::operator=(this_00,other_00);
  QSqlIndex::~QSqlIndex(this_00);
  QSqlRecord::count((QSqlRecord *)0x16ba5d);
  QSqlQueryModelPrivate::initColOffsets(this_01,size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModelPrivate::initRecordAndPrimaryIndex()
{
    rec = db.record(tableName);
    primaryIndex = db.primaryIndex(tableName);
    initColOffsets(rec.count());
}